

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O0

void mp::
     WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::array<int,1ul>,std::array<int,0ul>,mp::UnaryEncodingId>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::UnaryEncodingId>
               *cfc,ItemNamer *vnam)

{
  array<int,_0UL> *in_RDX;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_RSI;
  BasicWriter<char> *in_RDI;
  ItemNamer *unaff_retaddr;
  array<int,_1UL> *in_stack_00000008;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_00000010;
  BasicWriter<char> *s;
  char value;
  BasicWriter<char> *in_stack_ffffffffffffffb0;
  BasicWriter<char> *in_stack_ffffffffffffffd0;
  BasicStringRef<char> in_stack_ffffffffffffffd8;
  
  s = in_RDI;
  CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::UnaryEncodingId>::GetTypeName
            ();
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)in_stack_ffffffffffffffb0,(char *)s);
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffb0,(char)((ulong)s >> 0x38));
  CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::UnaryEncodingId>::
  GetArguments((CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::UnaryEncodingId>
                *)in_RSI);
  WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::array<int,1ul>,int>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr);
  fmt::BasicStringRef<char>::BasicStringRef((BasicStringRef<char> *)in_RDI,(char *)s);
  value = (char)((ulong)s >> 0x38);
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
  CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::UnaryEncodingId>::
  GetParameters((CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::UnaryEncodingId>
                 *)in_RSI);
  WriteModelItemParameters<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::array<int,0ul>,int>
            (in_RSI,in_RDX);
  fmt::BasicWriter<char>::operator<<(in_RDI,value);
  return;
}

Assistant:

inline void WriteModelItem(
    Writer& wrt,
    const CustomConstraintData<A,P,I>& cfc,
    ItemNamer& vnam) {
  wrt << cfc.GetTypeName();
  wrt << '(';
  WriteModelItem(wrt, cfc.GetArguments(), vnam);
  wrt << ", ";
  WriteModelItemParameters(wrt, cfc.GetParameters());
  wrt << ')';
}